

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O3

void __thiscall rsg::VariableType::~VariableType(VariableType *this)

{
  VariableType *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this_00 = this->m_elementType;
  if (this_00 != (VariableType *)0x0) {
    ~VariableType(this_00);
  }
  operator_delete(this_00,0x50);
  std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::~vector
            (&this->m_members);
  pcVar1 = (this->m_typeName)._M_dataplus._M_p;
  paVar2 = &(this->m_typeName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

inline VariableType::~VariableType (void)
{
	delete m_elementType;
}